

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

char * __thiscall CServerBrowser::GetFavoritePassword(CServerBrowser *this,char *pAddress)

{
  int iVar1;
  CFavoriteServer *pCVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  NETADDR Addr;
  NETADDR local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.type = 0;
  local_38.ip[0] = '\0';
  local_38.ip[1] = '\0';
  local_38.ip[2] = '\0';
  local_38.ip[3] = '\0';
  local_38.ip[4] = '\0';
  local_38.ip[5] = '\0';
  local_38.ip[6] = '\0';
  local_38.ip[7] = '\0';
  local_38.ip[8] = '\0';
  local_38.ip[9] = '\0';
  local_38.ip[10] = '\0';
  local_38.ip[0xb] = '\0';
  local_38.ip[0xc] = '\0';
  local_38.ip[0xd] = '\0';
  local_38.ip[0xe] = '\0';
  local_38.ip[0xf] = '\0';
  local_38.port = 0;
  local_38.reserved = 0;
  iVar1 = net_addr_from_str(&local_38,pAddress);
  if (iVar1 == 0) {
    pCVar2 = CServerBrowserFavorites::FindFavoriteByAddr
                       (&this->m_ServerBrowserFavorites,&local_38,(int *)0x0);
    pcVar3 = (char *)0x0;
    if (pCVar2 != (CFavoriteServer *)0x0) {
      pcVar3 = (char *)0x0;
      if (pCVar2->m_aPassword[0] != '\0') {
        pcVar3 = pCVar2->m_aPassword;
      }
    }
  }
  else {
    pcVar3 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pcVar3;
  }
  __stack_chk_fail();
}

Assistant:

const char *CServerBrowser::GetFavoritePassword(const char *pAddress)
{
	NETADDR Addr = {0};
	if(net_addr_from_str(&Addr, pAddress))
		return 0;
	CServerBrowserFavorites::CFavoriteServer *pFavorite = m_ServerBrowserFavorites.FindFavoriteByAddr(Addr, 0);
	if(!pFavorite)
		return 0;
	if(!pFavorite->m_aPassword[0])
		return 0;
	return pFavorite->m_aPassword;
}